

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
::iterator::skip_empty_or_deleted(iterator *this)

{
  bool bVar1;
  GroupSse2Impl local_28;
  uint32_t local_14;
  iterator *piStack_10;
  uint32_t shift;
  iterator *this_local;
  
  piStack_10 = this;
  if (this->ctrl_ != (ctrl_t *)0x0) {
    while (bVar1 = IsEmptyOrDeleted(*this->ctrl_), bVar1) {
      GroupSse2Impl::GroupSse2Impl(&local_28,this->ctrl_);
      local_14 = GroupSse2Impl::CountLeadingEmptyOrDeleted(&local_28);
      this->ctrl_ = this->ctrl_ + local_14;
      (this->field_1).slot_ = (this->field_1).slot_ + local_14;
    }
  }
  return;
}

Assistant:

void skip_empty_or_deleted() {
            PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
                // ctrl_ could be nullptr
                if (!ctrl_)
                    return;
            }
            while (IsEmptyOrDeleted(*ctrl_)) {
                // ctrl is not necessarily aligned to Group::kWidth. It is also likely
                // to read past the space for ctrl bytes and into slots. This is ok
                // because ctrl has sizeof() == 1 and slot has sizeof() >= 1 so there
                // is no way to read outside the combined slot array.
                uint32_t shift = Group{ctrl_}.CountLeadingEmptyOrDeleted();
                ctrl_ += shift;
                slot_ += shift;
            }
        }